

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseExportDesc(WastParser *this,Export *export_)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  Token local_b8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_72;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  iterator local_50;
  size_type local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  Enum local_24;
  Export *local_20;
  Export *export__local;
  WastParser *this_local;
  
  local_20 = export_;
  export__local = (Export *)this;
  local_24 = (Enum)Expect(this,Lpar);
  bVar1 = Failed((Result)local_24);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    TVar2 = Peek(this,0);
    switch(TVar2) {
    case Event:
      local_20->kind = Event;
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_70,"an external kind",&local_71);
      local_50 = &local_70;
      local_48 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_72);
      __l._M_len = local_48;
      __l._M_array = local_50;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_40,__l,&local_72);
      this_local._4_4_ = ErrorExpected(this,&local_40,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_40);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_72);
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50;
      do {
        local_d8 = local_d8 + -1;
        std::__cxx11::string::~string((string *)local_d8);
      } while (local_d8 != &local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      return (Result)this_local._4_4_;
    case Func:
      local_20->kind = First;
      break;
    case Global:
      local_20->kind = Global;
      break;
    case Memory:
      local_20->kind = Memory;
      break;
    case Table:
      local_20->kind = Table;
    }
    Consume(&local_b8,this);
    RVar3 = ParseVar(this,&local_20->var);
    bVar1 = Failed(RVar3);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar3 = Expect(this,Rpar);
      bVar1 = Failed(RVar3);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseExportDesc(Export* export_) {
  WABT_TRACE(ParseExportDesc);
  EXPECT(Lpar);
  switch (Peek()) {
    case TokenType::Func:   export_->kind = ExternalKind::Func; break;
    case TokenType::Table:  export_->kind = ExternalKind::Table; break;
    case TokenType::Memory: export_->kind = ExternalKind::Memory; break;
    case TokenType::Global: export_->kind = ExternalKind::Global; break;
    case TokenType::Event:  export_->kind = ExternalKind::Event; break;
    default:
      return ErrorExpected({"an external kind"});
  }
  Consume();
  CHECK_RESULT(ParseVar(&export_->var));
  EXPECT(Rpar);
  return Result::Ok;
}